

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitCallRef(FunctionValidator *this,CallRef *curr)

{
  bool bVar1;
  HeapType HVar2;
  
  validateReturnCall<wasm::CallRef>(this,curr);
  shouldBeTrue<wasm::CallRef*>
            (this,(bool)((byte)((((this->
                                  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                  .
                                  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                 .currModule)->features).features >> 10) & 1),curr,
             "call_ref requires gc [--enable-gc]");
  if ((curr->target->type).id != 1) {
    bVar1 = wasm::Type::isRef(&curr->target->type);
    if ((bVar1) && (HVar2 = wasm::Type::getHeapType(&curr->target->type), HVar2.id == 0xd)) {
      return;
    }
    bVar1 = wasm::Type::isFunction(&curr->target->type);
    bVar1 = shouldBeTrue<wasm::CallRef*>
                      (this,bVar1,curr,"call_ref target must be a function reference");
    if (bVar1) {
      HVar2 = wasm::Type::getHeapType(&curr->target->type);
      validateCallParamsAndResult<wasm::CallRef>(this,curr,HVar2);
      return;
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitCallRef(CallRef* curr) {
  validateReturnCall(curr);
  shouldBeTrue(
    getModule()->features.hasGC(), curr, "call_ref requires gc [--enable-gc]");
  if (curr->target->type == Type::unreachable ||
      (curr->target->type.isRef() &&
       curr->target->type.getHeapType() == HeapType::nofunc)) {
    return;
  }
  if (shouldBeTrue(curr->target->type.isFunction(),
                   curr,
                   "call_ref target must be a function reference")) {
    validateCallParamsAndResult(curr, curr->target->type.getHeapType());
  }
}